

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O0

void __thiscall hgdb::rtl::Serializer::handle(Serializer *this,InstanceSymbol *inst)

{
  SymbolTable *this_00;
  Module *pMVar1;
  Scope<std::nullptr_t> *pSVar2;
  string_view *psVar3;
  mapped_type *ppMVar4;
  Scope<std::nullptr_t> *pSVar5;
  string local_1d0 [32];
  path local_1b0;
  path local_188;
  path local_160;
  string local_138;
  allocator<char> local_111;
  SourceLocation local_110;
  string_view local_108;
  undefined1 local_f8 [8];
  string filename;
  ScopeBase *temp_root_scope_;
  Scope<std::nullptr_t> *temp_current_scope_;
  allocator<char> local_a1;
  string local_a0;
  Module *local_80;
  Module *parent_module;
  allocator<char> local_61;
  string local_60;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_40;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_38;
  byte local_29;
  Module *pMStack_28;
  bool visited;
  Module *inst_module;
  Definition *def;
  InstanceSymbol *inst_local;
  Serializer *this_local;
  
  def = (Definition *)inst;
  inst_local = (InstanceSymbol *)this;
  inst_module = (Module *)slang::ast::InstanceSymbol::getDefinition(inst);
  pMStack_28 = (Module *)0x0;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::find(&this->definitions_,(key_type *)inst_module);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::end(&this->definitions_);
  local_29 = std::__detail::operator!=(&local_38,&local_40);
  pMVar1 = inst_module;
  if ((bool)local_29) {
    ppMVar4 = std::
              unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_hgdb::json::Module_*,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_hgdb::json::Module_*>_>_>
              ::at(&this->def_module_mapping_,(key_type *)inst_module);
    pMStack_28 = *ppMVar4;
  }
  else {
    this_00 = this->table_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_60,(basic_string_view<char,_std::char_traits<char>_> *)pMVar1,
               &local_61);
    pMStack_28 = json::SymbolTable::add_module(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  pMVar1 = this->current_module_;
  local_80 = pMVar1;
  if (pMVar1 != (Module *)0x0) {
    psVar3 = &def->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_a0,
               (basic_string_view<char,_std::char_traits<char>_> *)&psVar3->_M_str,&local_a1);
    json::Module::add_instance(pMVar1,&local_a0,pMStack_28);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  if ((local_29 & 1) == 0) {
    std::
    unordered_set<std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace<std::basic_string_view<char,std::char_traits<char>>const&>
              ((unordered_set<std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&this->definitions_,
               (basic_string_view<char,_std::char_traits<char>_> *)inst_module);
    this->current_module_ = pMStack_28;
    std::
    unordered_map<std::basic_string_view<char,std::char_traits<char>>,hgdb::json::Module*,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,hgdb::json::Module*>>>
    ::emplace<std::basic_string_view<char,std::char_traits<char>>const&,hgdb::json::Module*&>
              ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,hgdb::json::Module*,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,hgdb::json::Module*>>>
                *)&this->def_module_mapping_,
               (basic_string_view<char,_std::char_traits<char>_> *)inst_module,
               &this->current_module_);
    pSVar2 = this->current_scope_;
    filename.field_2._8_8_ = this->root_scope_;
    pSVar5 = json::Scope<hgdb::json::Module>::create_scope<hgdb::json::Scope<decltype(nullptr)>>
                       (&this->current_module_->super_Scope<hgdb::json::Module>);
    this->current_scope_ = pSVar5;
    local_110 = (SourceLocation)def->syntax;
    local_108 = slang::SourceManager::getFileName(this->sm_,local_110);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_f8,&local_108,&local_111);
    std::allocator<char>::~allocator(&local_111);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               auto_format);
    std::filesystem::absolute(&local_188);
    std::filesystem::canonical(&local_160);
    std::filesystem::__cxx11::path::string(&local_138,&local_160);
    std::__cxx11::string::operator=((string *)local_f8,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::filesystem::__cxx11::path::~path(&local_160);
    std::filesystem::__cxx11::path::~path(&local_188);
    std::filesystem::__cxx11::path::~path(&local_1b0);
    std::__cxx11::string::string(local_1d0,(string *)local_f8);
    std::__cxx11::string::operator=((string *)&this->current_scope_->filename,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    this->root_scope_ = &this->current_scope_->super_ScopeBase;
    slang::ast::ASTVisitor<hgdb::rtl::Serializer,_true,_false>::
    visitDefault<slang::ast::InstanceSymbol>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)this,(InstanceSymbol *)def);
    this->current_module_ = local_80;
    this->current_scope_ = pSVar2;
    this->root_scope_ = (ScopeBase *)filename.field_2._8_8_;
    std::__cxx11::string::~string((string *)local_f8);
  }
  return;
}

Assistant:

void handle(const slang::ast::InstanceSymbol &inst) {
        auto const *def = &inst.getDefinition();
        hgdb::json::Module *inst_module = nullptr;
        auto visited = definitions_.find(def->name) != definitions_.end();
        if (!visited) {
            inst_module = table_.add_module(std::string(def->name));
        } else {
            inst_module = def_module_mapping_.at(def->name);
        }

        auto *parent_module = current_module_;

        if (parent_module) {
            parent_module->add_instance(std::string(inst.name), inst_module);
        }

        // only visit unique definition
        if (visited) return;
        definitions_.emplace(def->name);

        current_module_ = inst_module;
        def_module_mapping_.emplace(def->name, current_module_);

        auto *temp_current_scope_ = current_scope_;
        auto *temp_root_scope_ = root_scope_;
        // to make things easier, everything is wrapped in a single scope
        current_scope_ = current_module_->create_scope<hgdb::json::Scope<>>();
        auto filename = std::string(sm_.getFileName(inst.location));
        filename = std::filesystem::canonical(std::filesystem::absolute(filename)).string();
        current_scope_->filename = std::string(filename);
        root_scope_ = current_scope_;

        visitDefault(inst);
        // reset
        current_module_ = parent_module;
        current_scope_ = temp_current_scope_;
        root_scope_ = temp_root_scope_;
    }